

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O2

DSFrame * __thiscall
DSFrame::Create(DSFrame *__return_storage_ptr__,DSFrame *this,bool copy,bool inplace)

{
  int iVar1;
  int64_t iVar2;
  DSVideoInfo vi;
  VSFrameRef *apVVar3 [1];
  VSFrameRef *src;
  uchar **ppuVar4;
  uint8_t *puVar5;
  undefined8 *puVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  DSFormat *pDVar7;
  ulong uVar8;
  int i;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef0 [80];
  VSFrameRef *copy_frames [1];
  int copy_planes [4];
  DSFormat local_88;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  int local_50;
  undefined8 local_4c;
  int64_t local_40;
  undefined8 uStack_38;
  
  bVar11 = 0;
  if (this->_vssrc == (VSFrameRef *)0x0) {
    if ((this->_avssrc).p == (VideoFrame *)0x0) {
      puVar6 = (undefined8 *)
               __cxa_allocate_exception
                         (8,this,CONCAT71(in_register_00000011,copy),
                          CONCAT71(in_register_00000009,inplace));
      *puVar6 = "Unable to create from nothing.";
      __cxa_throw(puVar6,&char_const*::typeinfo,0);
    }
    iVar1 = (this->_vi).num_frames;
    iVar2 = (this->_vi).num_audio_samples;
    uVar8._0_4_ = (this->_vi).fps_numerator;
    uVar8._4_4_ = (this->_vi).fps_denominator;
    DSFormat::DSFormat(&local_88,(this->_vi).pixel_type);
    local_68 = uVar8 & 0xffffffff;
    uStack_60 = uVar8 >> 0x20;
    local_58._0_4_ = (this->_vi).width;
    local_58._4_4_ = (this->_vi).height;
    local_50 = iVar1;
    local_4c._0_4_ = (this->_vi).audio_samples_per_second;
    local_4c._4_4_ = (this->_vi).sample_type;
    local_40 = iVar2;
    uStack_38._0_4_ = (this->_vi).nchannels;
    uStack_38._4_4_ = (this->_vi).image_type;
    pDVar7 = &local_88;
    puVar6 = (undefined8 *)&stack0xfffffffffffffee8;
    for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar6 = *(undefined8 *)pDVar7;
      pDVar7 = (DSFormat *)((long)pDVar7 + (ulong)bVar11 * -0x10 + 8);
      puVar6 = puVar6 + (ulong)bVar11 * -2 + 1;
    }
    vi.Format.SSW = in_stack_fffffffffffffef0._0_4_;
    vi.Format.SSH = in_stack_fffffffffffffef0._4_4_;
    vi.Format.BitsPerSample = in_stack_fffffffffffffef0._8_4_;
    vi.Format.BytesPerSample = in_stack_fffffffffffffef0._12_4_;
    vi.Format.Planes = in_stack_fffffffffffffef0._16_4_;
    vi._28_4_ = in_stack_fffffffffffffef0._20_4_;
    vi.FPSNum = in_stack_fffffffffffffef0._24_8_;
    vi.FPSDenom = in_stack_fffffffffffffef0._32_8_;
    vi.Width = in_stack_fffffffffffffef0._40_4_;
    vi.Height = in_stack_fffffffffffffef0._44_4_;
    vi.Frames = in_stack_fffffffffffffef0._48_4_;
    vi.Audio_SPS = in_stack_fffffffffffffef0._52_4_;
    vi.Audio_SType = in_stack_fffffffffffffef0._56_4_;
    vi._68_4_ = in_stack_fffffffffffffef0._60_4_;
    vi.Audio_NSamples = in_stack_fffffffffffffef0._64_8_;
    vi.Audio_NChannels = in_stack_fffffffffffffef0._72_4_;
    vi.Field = in_stack_fffffffffffffef0._76_4_;
    vi.Format.IsFamilyYUV = (bool)(char)in_stack_fffffffffffffee8;
    vi.Format.IsFamilyRGB = (bool)(char)((ulong)in_stack_fffffffffffffee8 >> 8);
    vi.Format.IsFamilyYCC = (bool)(char)((ulong)in_stack_fffffffffffffee8 >> 0x10);
    vi.Format.IsInteger = (bool)(char)((ulong)in_stack_fffffffffffffee8 >> 0x18);
    vi.Format.IsFloat = (bool)(char)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    vi.Format._5_3_ = (int3)((ulong)in_stack_fffffffffffffee8 >> 0x28);
    Create(__return_storage_ptr__,this,vi);
  }
  else {
    apVVar3[0] = ToVSFrame(this);
    copy_planes[0] = 0;
    copy_planes[1] = 0;
    copy_planes[2] = 0;
    copy_planes[3] = 0;
    copy_frames[0] = apVVar3[0];
    if (copy) {
      src = (*this->_vsapi->newVideoFrame2)
                      (this->_vsformat,this->FrameWidth,this->FrameHeight,copy_frames,copy_planes,
                       this->_vssrc,this->_vscore);
      apVVar3[0] = copy_frames[0];
    }
    else {
      src = (*this->_vsapi->newVideoFrame)
                      (this->_vsformat,this->FrameWidth,this->FrameHeight,this->_vssrc,this->_vscore
                      );
    }
    (*this->_vsapi->freeFrame)(apVVar3[0]);
    DSFrame(__return_storage_ptr__,src,this->_vscore,this->_vsapi);
    __return_storage_ptr__->_vsdst = src;
    uVar10 = (ulong)(this->Format).Planes;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (long)uVar10) {
      uVar8 = uVar10 * 8;
    }
    ppuVar4 = (uchar **)operator_new__(uVar8);
    __return_storage_ptr__->DstPointers = ppuVar4;
    for (lVar9 = 0; lVar9 < (int)uVar10; lVar9 = lVar9 + 1) {
      puVar5 = (*this->_vsapi->getWritePtr)(src,(int)lVar9);
      __return_storage_ptr__->DstPointers[lVar9] = puVar5;
      uVar10 = (ulong)(uint)(this->Format).Planes;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DSFrame Create(bool copy, bool inplace)
  {
    if (_vssrc) {
      // Create a new VS frame
      const VSFrameRef* copy_frames[1] {ToVSFrame()};
      int copy_planes[4] = {0};
      auto vsframe = copy ?
        _vsapi->newVideoFrame2(_vsformat, FrameWidth, FrameHeight, copy_frames, copy_planes, _vssrc, const_cast<VSCore*>(_vscore)) :
        _vsapi->newVideoFrame(_vsformat, FrameWidth, FrameHeight, _vssrc, const_cast<VSCore*>(_vscore));
      _vsapi->freeFrame(copy_frames[0]);

      DSFrame new_frame(vsframe, _vscore, _vsapi);
      new_frame._vsdst = vsframe;
      new_frame.DstPointers = new unsigned char*[Format.Planes];
      for (int i = 0; i < Format.Planes; i++)
        new_frame.DstPointers[i] = _vsapi->getWritePtr(vsframe, i);
      return new_frame;
    }
    else if(_avssrc) {
      // Create a new AVS frame
      return Create(_vi);
    }
    throw "Unable to create from nothing.";
  }